

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cc
# Opt level: O3

void __thiscall FloatFormat::FloatFormat(FloatFormat *this,int4 sz)

{
  byte bVar1;
  
  this->size = sz;
  if (sz == 4) {
    this->exp_size = 8;
    this->bias = 0x7f;
    this->signbit_pos = 0x1f;
    this->frac_pos = 0;
    this->frac_size = 0x17;
    this->exp_pos = 0x17;
    this->jbitimplied = true;
    bVar1 = 8;
  }
  else if (sz == 8) {
    this->exp_size = 0xb;
    this->bias = 0x3ff;
    this->signbit_pos = 0x3f;
    this->frac_pos = 0;
    this->frac_size = 0x34;
    this->exp_pos = 0x34;
    this->jbitimplied = true;
    bVar1 = 0xb;
  }
  else {
    bVar1 = (byte)this->exp_size;
  }
  this->maxexponent = ~(-1 << (bVar1 & 0x1f));
  return;
}

Assistant:

FloatFormat::FloatFormat(int4 sz)

{
  size = sz;

  if (size == 4) {
    signbit_pos = 31;
    exp_pos = 23;
    exp_size = 8;
    frac_pos = 0;
    frac_size = 23;
    bias = 127;
    jbitimplied = true;
  }
  else if (size == 8) {
    signbit_pos = 63;
    exp_pos = 52;
    exp_size = 11;
    frac_pos = 0;
    frac_size = 52;
    bias = 1023;
    jbitimplied = true;
  }
  maxexponent = (1<<exp_size)-1;
}